

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O0

void __thiscall adios2::core::engine::InlineWriter::ResetVariables(InlineWriter *this)

{
  bool bVar1;
  DataType DVar2;
  DataType DVar3;
  DataType DVar4;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pVVar5
  ;
  Variable<char> *pVVar6;
  Variable<int> *pVVar7;
  Variable<long> *pVVar8;
  Variable<unsigned_char> *pVVar9;
  Variable<unsigned_short> *pVVar10;
  Variable<unsigned_int> *pVVar11;
  Variable<unsigned_long> *pVVar12;
  Variable<float> *pVVar13;
  Variable<double> *pVVar14;
  Variable<long_double> *pVVar15;
  Variable<std::complex<float>_> *pVVar16;
  Variable<std::complex<double>_> *pVVar17;
  long in_RDI;
  Variable<std::complex<double>_> *variable_14;
  Variable<std::complex<float>_> *variable_13;
  Variable<long_double> *variable_12;
  Variable<double> *variable_11;
  Variable<float> *variable_10;
  Variable<unsigned_long> *variable_9;
  Variable<unsigned_int> *variable_8;
  Variable<unsigned_short> *variable_7;
  Variable<unsigned_char> *variable_6;
  Variable<long> *variable_5;
  Variable<int> *variable_4;
  Variable<short> *variable_3;
  Variable<signed_char> *variable_2;
  Variable<char> *variable_1;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable;
  DataType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *varPair;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  availVars;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *in_stack_fffffffffffffa98;
  Engine *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad0;
  DataType in_stack_fffffffffffffad4;
  undefined4 in_stack_fffffffffffffbf0;
  DataType in_stack_fffffffffffffbf4;
  Variable<short> *in_stack_fffffffffffffbf8;
  Engine *in_stack_fffffffffffffc00;
  allocator local_371;
  string local_370 [32];
  Variable<std::complex<double>_> *local_350;
  undefined1 local_341 [33];
  Variable<std::complex<float>_> *local_320;
  allocator local_311;
  string local_310 [32];
  Variable<long_double> *local_2f0;
  allocator local_2e1;
  string local_2e0 [32];
  Variable<double> *local_2c0;
  allocator local_2b1;
  string local_2b0 [32];
  Variable<float> *local_290;
  allocator local_281;
  string local_280 [32];
  Variable<unsigned_long> *local_260;
  allocator local_251;
  string local_250 [32];
  Variable<unsigned_int> *local_230;
  allocator local_221;
  string local_220 [32];
  Variable<unsigned_short> *local_200;
  allocator local_1f1;
  string local_1f0 [32];
  Variable<unsigned_char> *local_1d0;
  allocator local_1c1;
  string local_1c0 [32];
  Variable<long> *local_1a0;
  allocator local_191;
  string local_190 [32];
  Variable<int> *local_170;
  allocator local_161;
  string local_160 [32];
  Variable<short> *local_140;
  allocator local_131;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffed0;
  IO *in_stack_fffffffffffffed8;
  allocator local_101;
  string local_100 [32];
  Variable<char> *local_e0;
  allocator local_c1;
  string local_c0 [32];
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  DataType local_94;
  Engine *local_90;
  Engine *local_88;
  _Self local_80;
  _Self local_78;
  undefined1 *local_70;
  undefined1 local_68 [48];
  undefined1 local_38 [56];
  
  memset(local_68,0,0x30);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0xac017c);
  IO::GetAvailableVariables(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0xac01a6);
  local_70 = local_38;
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
       ::begin(in_stack_fffffffffffffa98);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
       ::end(in_stack_fffffffffffffa98);
  while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
    local_90 = (Engine *)
               std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            *)0xac020b);
    local_88 = local_90;
    DVar2 = IO::InquireVariableType
                      ((IO *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                       in_stack_fffffffffffffac8);
    local_94 = DVar2;
    if (DVar2 != Struct) {
      DVar3 = helper::GetDataType<std::__cxx11::string>();
      DVar4 = local_94;
      if (DVar2 == DVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c0,"in call to BeginStep",&local_c1);
        pVVar5 = Engine::FindVariable<std::__cxx11::string>
                           (in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,
                            (string *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0))
        ;
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        local_a0 = pVVar5;
        std::
        vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
        ::clear((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                 *)0xac0321);
      }
      else {
        DVar3 = helper::GetDataType<char>();
        DVar2 = local_94;
        if (DVar4 == DVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_100,"in call to BeginStep",&local_101);
          pVVar6 = Engine::FindVariable<char>
                             (in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,
                              (string *)
                              CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
          std::__cxx11::string::~string(local_100);
          std::allocator<char>::~allocator((allocator<char> *)&local_101);
          local_e0 = pVVar6;
          std::
          vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
          ::clear((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                   *)0xac043b);
        }
        else {
          DVar3 = helper::GetDataType<signed_char>();
          DVar4 = local_94;
          if (DVar2 == DVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&stack0xfffffffffffffed0,"in call to BeginStep",&local_131);
            Engine::FindVariable<signed_char>
                      (in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,
                       (string *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
            std::allocator<char>::~allocator((allocator<char> *)&local_131);
            std::
            vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
            ::clear((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                     *)0xac0555);
          }
          else {
            DVar2 = helper::GetDataType<short>();
            if (DVar4 == DVar2) {
              in_stack_fffffffffffffc00 = local_90;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_160,"in call to BeginStep",&local_161);
              in_stack_fffffffffffffbf8 =
                   Engine::FindVariable<short>
                             (in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,
                              (string *)
                              CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
              std::__cxx11::string::~string(local_160);
              std::allocator<char>::~allocator((allocator<char> *)&local_161);
              local_140 = in_stack_fffffffffffffbf8;
              std::
              vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
              ::clear((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                       *)0xac066f);
            }
            else {
              in_stack_fffffffffffffbf4 = local_94;
              DVar4 = helper::GetDataType<int>();
              DVar2 = local_94;
              if (in_stack_fffffffffffffbf4 == DVar4) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_190,"in call to BeginStep",&local_191);
                pVVar7 = Engine::FindVariable<int>
                                   (in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,
                                    (string *)
                                    CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                std::__cxx11::string::~string(local_190);
                std::allocator<char>::~allocator((allocator<char> *)&local_191);
                local_170 = pVVar7;
                std::
                vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                ::clear((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                         *)0xac0789);
              }
              else {
                DVar3 = helper::GetDataType<long>();
                DVar4 = local_94;
                if (DVar2 == DVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_1c0,"in call to BeginStep",&local_1c1);
                  pVVar8 = Engine::FindVariable<long>
                                     (in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,
                                      (string *)
                                      CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0))
                  ;
                  std::__cxx11::string::~string(local_1c0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
                  local_1a0 = pVVar8;
                  std::
                  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                  ::clear((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                           *)0xac08a3);
                }
                else {
                  DVar3 = helper::GetDataType<unsigned_char>();
                  DVar2 = local_94;
                  if (DVar4 == DVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_1f0,"in call to BeginStep",&local_1f1);
                    pVVar9 = Engine::FindVariable<unsigned_char>
                                       (in_stack_fffffffffffffc00,
                                        (string *)in_stack_fffffffffffffbf8,
                                        (string *)
                                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0
                                                ));
                    std::__cxx11::string::~string(local_1f0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
                    local_1d0 = pVVar9;
                    std::
                    vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                    ::clear((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                             *)0xac09bd);
                  }
                  else {
                    DVar3 = helper::GetDataType<unsigned_short>();
                    DVar4 = local_94;
                    if (DVar2 == DVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_220,"in call to BeginStep",&local_221);
                      pVVar10 = Engine::FindVariable<unsigned_short>
                                          (in_stack_fffffffffffffc00,
                                           (string *)in_stack_fffffffffffffbf8,
                                           (string *)
                                           CONCAT44(in_stack_fffffffffffffbf4,
                                                    in_stack_fffffffffffffbf0));
                      std::__cxx11::string::~string(local_220);
                      std::allocator<char>::~allocator((allocator<char> *)&local_221);
                      local_200 = pVVar10;
                      std::
                      vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                      ::clear((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                               *)0xac0ad7);
                    }
                    else {
                      DVar3 = helper::GetDataType<unsigned_int>();
                      DVar2 = local_94;
                      if (DVar4 == DVar3) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_250,"in call to BeginStep",&local_251);
                        pVVar11 = Engine::FindVariable<unsigned_int>
                                            (in_stack_fffffffffffffc00,
                                             (string *)in_stack_fffffffffffffbf8,
                                             (string *)
                                             CONCAT44(in_stack_fffffffffffffbf4,
                                                      in_stack_fffffffffffffbf0));
                        std::__cxx11::string::~string(local_250);
                        std::allocator<char>::~allocator((allocator<char> *)&local_251);
                        local_230 = pVVar11;
                        std::
                        vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                        ::clear((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                 *)0xac0bf1);
                      }
                      else {
                        DVar3 = helper::GetDataType<unsigned_long>();
                        DVar4 = local_94;
                        if (DVar2 == DVar3) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_280,"in call to BeginStep",&local_281);
                          pVVar12 = Engine::FindVariable<unsigned_long>
                                              (in_stack_fffffffffffffc00,
                                               (string *)in_stack_fffffffffffffbf8,
                                               (string *)
                                               CONCAT44(in_stack_fffffffffffffbf4,
                                                        in_stack_fffffffffffffbf0));
                          std::__cxx11::string::~string(local_280);
                          std::allocator<char>::~allocator((allocator<char> *)&local_281);
                          local_260 = pVVar12;
                          std::
                          vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                          ::clear((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                   *)0xac0d0b);
                        }
                        else {
                          DVar3 = helper::GetDataType<float>();
                          DVar2 = local_94;
                          if (DVar4 == DVar3) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      (local_2b0,"in call to BeginStep",&local_2b1);
                            pVVar13 = Engine::FindVariable<float>
                                                (in_stack_fffffffffffffc00,
                                                 (string *)in_stack_fffffffffffffbf8,
                                                 (string *)
                                                 CONCAT44(in_stack_fffffffffffffbf4,
                                                          in_stack_fffffffffffffbf0));
                            std::__cxx11::string::~string(local_2b0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
                            local_290 = pVVar13;
                            std::
                            vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                            ::clear((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                     *)0xac0e25);
                          }
                          else {
                            DVar3 = helper::GetDataType<double>();
                            DVar4 = local_94;
                            if (DVar2 == DVar3) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_2e0,"in call to BeginStep",&local_2e1);
                              pVVar14 = Engine::FindVariable<double>
                                                  (in_stack_fffffffffffffc00,
                                                   (string *)in_stack_fffffffffffffbf8,
                                                   (string *)
                                                   CONCAT44(in_stack_fffffffffffffbf4,
                                                            in_stack_fffffffffffffbf0));
                              std::__cxx11::string::~string(local_2e0);
                              std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
                              local_2c0 = pVVar14;
                              std::
                              vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                              ::clear((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                       *)0xac0f27);
                            }
                            else {
                              DVar2 = helper::GetDataType<long_double>();
                              if (DVar4 == DVar2) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_310,"in call to BeginStep",&local_311);
                                pVVar15 = Engine::FindVariable<long_double>
                                                    (in_stack_fffffffffffffc00,
                                                     (string *)in_stack_fffffffffffffbf8,
                                                     (string *)
                                                     CONCAT44(in_stack_fffffffffffffbf4,
                                                              in_stack_fffffffffffffbf0));
                                std::__cxx11::string::~string(local_310);
                                std::allocator<char>::~allocator((allocator<char> *)&local_311);
                                local_2f0 = pVVar15;
                                std::
                                vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                ::clear((vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                         *)0xac1029);
                              }
                              else {
                                in_stack_fffffffffffffad4 = local_94;
                                DVar4 = helper::GetDataType<std::complex<float>>();
                                DVar2 = local_94;
                                if (in_stack_fffffffffffffad4 == DVar4) {
                                  in_stack_fffffffffffffac8 = (string *)local_341;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)(local_341 + 1),"in call to BeginStep",
                                             (allocator *)in_stack_fffffffffffffac8);
                                  pVVar16 = Engine::FindVariable<std::complex<float>>
                                                      (in_stack_fffffffffffffc00,
                                                       (string *)in_stack_fffffffffffffbf8,
                                                       (string *)
                                                       CONCAT44(in_stack_fffffffffffffbf4,
                                                                in_stack_fffffffffffffbf0));
                                  std::__cxx11::string::~string((string *)(local_341 + 1));
                                  std::allocator<char>::~allocator((allocator<char> *)local_341);
                                  local_320 = pVVar16;
                                  std::
                                  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                  ::clear((vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                           *)0xac112b);
                                }
                                else {
                                  DVar4 = helper::GetDataType<std::complex<double>>();
                                  if (DVar2 == DVar4) {
                                    in_stack_fffffffffffffaa0 = local_90;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              (local_370,"in call to BeginStep",&local_371);
                                    pVVar17 = Engine::FindVariable<std::complex<double>>
                                                        (in_stack_fffffffffffffc00,
                                                         (string *)in_stack_fffffffffffffbf8,
                                                         (string *)
                                                         CONCAT44(in_stack_fffffffffffffbf4,
                                                                  in_stack_fffffffffffffbf0));
                                    std::__cxx11::string::~string(local_370);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_371);
                                    local_350 = pVVar17;
                                    std::
                                    vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                    ::clear((vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                             *)0xac122b);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffaa0);
  }
  *(undefined1 *)(in_RDI + 0xd1) = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          *)0xac12c1);
  return;
}

Assistant:

void InlineWriter::ResetVariables()
{
    auto availVars = m_IO.GetAvailableVariables();
    for (auto &varPair : availVars)
    {
        const auto &name = varPair.first;
        const DataType type = m_IO.InquireVariableType(name);

        if (type == DataType::Struct)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> &variable = FindVariable<T>(name, "in call to BeginStep");                     \
        variable.m_BlocksInfo.clear();                                                             \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    }
    m_ResetVariables = false;
}